

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
          (CodedInputStream *this,uint32_t *value)

{
  bool bVar1;
  int iVar2;
  uint8_t *local_38;
  uint8_t *ptr;
  undefined8 uStack_28;
  uint8_t bytes [4];
  size_t kSize;
  uint32_t *value_local;
  CodedInputStream *this_local;
  
  uStack_28 = 4;
  iVar2 = BufferSize(this);
  if (iVar2 < 4) {
    bVar1 = ReadRaw(this,(void *)((long)&ptr + 4),4);
    if (!bVar1) {
      return false;
    }
    local_38 = (uint8_t *)((long)&ptr + 4);
  }
  else {
    local_38 = *(uint8_t **)this;
    Advance(this,4);
  }
  ReadLittleEndian32FromArray(local_38,value);
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian32Fallback(uint32_t* value) {
  constexpr size_t kSize = sizeof(*value);
  uint8_t bytes[kSize];

  const uint8_t* ptr;
  if (BufferSize() >= static_cast<int64_t>(kSize)) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(kSize);
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, kSize)) return false;
    ptr = bytes;
  }
  ReadLittleEndian32FromArray(ptr, value);
  return true;
}